

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void phmap::container_internal::
     Deallocate<8ul,std::allocator<std::pair<unsigned_int_const,unsigned_long>>>
               (allocator<std::pair<const_unsigned_int,_unsigned_long>_> *alloc,void *p,size_t n)

{
  allocator<phmap::container_internal::Deallocate<8ul,std::allocator<std::pair<unsigned_int_const,unsigned_long>>>(std::allocator<std::pair<unsigned_int_const,unsigned_long>>*,void*,unsigned_long)::M>
  local_21;
  size_t sStack_20;
  A mem_alloc;
  size_t n_local;
  void *p_local;
  allocator<std::pair<const_unsigned_int,_unsigned_long>_> *alloc_local;
  
  sStack_20 = n;
  if (n == 0) {
    __assert_fail("n && \"n must be positive\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x2c5,
                  "void phmap::container_internal::Deallocate(Alloc *, void *, size_t) [Alignment = 8UL, Alloc = std::allocator<std::pair<const unsigned int, unsigned long>>]"
                 );
  }
  std::
  allocator<phmap::container_internal::Deallocate<8ul,std::allocator<std::pair<unsigned_int_const,unsigned_long>>>(std::allocator<std::pair<unsigned_int_const,unsigned_long>>*,void*,unsigned_long)::M>
  ::allocator<std::pair<unsigned_int_const,unsigned_long>>(&local_21,alloc);
  allocator_traits<std::allocator<M>_>::deallocate
            ((allocator<M> *)&local_21,(pointer)p,sStack_20 + 7 >> 3);
  std::allocator<M>::~allocator((allocator<M> *)&local_21);
  return;
}

Assistant:

void Deallocate(Alloc* alloc, void* p, size_t n) {
  static_assert(Alignment > 0, "");
  assert(n && "n must be positive");
  struct alignas(Alignment) M {};
  using A = typename phmap::allocator_traits<Alloc>::template rebind_alloc<M>;
  using AT = typename phmap::allocator_traits<Alloc>::template rebind_traits<M>;
  A mem_alloc(*alloc);
  AT::deallocate(mem_alloc, static_cast<M*>(p),
                 (n + sizeof(M) - 1) / sizeof(M));
}